

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

float Abc_NtkDelayTrace(Abc_Ntk_t *pNtk,Abc_Obj_t *pOut,Abc_Obj_t *pIn,int fPrint)

{
  float fVar1;
  long *plVar2;
  float *pfVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iPin;
  Vec_Ptr_t *pVVar7;
  Vec_Ptr_t *vPath;
  void **ppvVar8;
  Vec_Int_t *vBest;
  int *piVar9;
  Abc_Time_t *pAVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  Abc_Obj_t *pAVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  int local_70;
  Abc_Obj_t *local_68;
  Vec_Int_t *local_60;
  
  if ((pNtk->ntkFunc != ABC_FUNC_MAP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsMappedLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,0x3e6,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if ((pOut != (Abc_Obj_t *)0x0) && ((*(uint *)&pOut->field_0x14 & 0xf) - 5 < 0xfffffffe)) {
    __assert_fail("pOut == NULL || Abc_ObjIsCo(pOut)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                  ,999,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  if (pIn == (Abc_Obj_t *)0x0) {
    if (pOut != (Abc_Obj_t *)0x0 || fPrint != 0) goto LAB_0031c435;
    bVar4 = false;
    local_60 = (Vec_Int_t *)0x0;
  }
  else {
    uVar5 = *(uint *)&pIn->field_0x14 & 0xf;
    if ((uVar5 != 5) && (uVar5 != 2)) {
      __assert_fail("pIn == NULL || Abc_ObjIsCi(pIn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,1000,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
    }
LAB_0031c435:
    bVar4 = fPrint != 0;
    local_60 = Abc_NtkDelayTraceSlackStart(pNtk);
  }
  Abc_NtkTimePrepare(pNtk);
  pVVar7 = Abc_NtkDfs(pNtk,1);
  if (0 < pVVar7->nSize) {
    lVar16 = 0;
    do {
      Abc_NodeDelayTraceArrival((Abc_Obj_t *)pVVar7->pArray[lVar16],local_60);
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar7->nSize);
  }
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  pVVar7 = pNtk->vCos;
  lVar16 = (long)pVVar7->nSize;
  if (lVar16 < 1) {
    if ((bool)(pOut == (Abc_Obj_t *)0x0 & bVar4)) goto LAB_0031ccc5;
    fVar20 = -1e+09;
  }
  else {
    fVar20 = -1e+09;
    lVar15 = 0;
    do {
      plVar2 = *(long **)(*(long *)(*(long *)(*pVVar7->pArray[lVar15] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar7->pArray[lVar15] + 0x20) * 8);
      pfVar3 = *(float **)
                (*(long *)(*(long *)(*(long *)(*plVar2 + 0x108) + 0x10) + 8) +
                (long)(int)plVar2[2] * 8);
      fVar21 = pfVar3[1];
      fVar23 = *pfVar3;
      if (fVar21 <= fVar23) {
        fVar21 = fVar23;
      }
      if (fVar21 <= fVar20) {
        fVar21 = fVar20;
      }
      fVar20 = fVar21;
      lVar15 = lVar15 + 1;
    } while (lVar16 != lVar15);
    if ((bool)(pOut == (Abc_Obj_t *)0x0 & bVar4)) {
      if (pVVar7->nSize < 1) {
LAB_0031ccc5:
        __assert_fail("pOut != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                      ,0x409,"float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
      }
      lVar15 = 0;
      pAVar18 = (Abc_Obj_t *)0x0;
      do {
        pOut = (Abc_Obj_t *)pVVar7->pArray[lVar15];
        plVar2 = (long *)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray];
        pfVar3 = *(float **)
                  (*(long *)(*(long *)(*(long *)(*plVar2 + 0x108) + 0x10) + 8) +
                  (long)(int)plVar2[2] * 8);
        fVar23 = pfVar3[1];
        fVar21 = *pfVar3;
        if (fVar23 <= fVar21) {
          fVar23 = fVar21;
        }
        if (fVar20 != fVar23) {
          pOut = pAVar18;
        }
        if (NAN(fVar20) || NAN(fVar23)) {
          pOut = pAVar18;
        }
        lVar15 = lVar15 + 1;
        pAVar18 = pOut;
      } while (lVar16 != lVar15);
      if (pOut == (Abc_Obj_t *)0x0) goto LAB_0031ccc5;
    }
  }
  if (!bVar4) goto LAB_0031cbf6;
  vPath = (Vec_Ptr_t *)malloc(0x10);
  vPath->nCap = 100;
  vPath->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  vPath->pArray = ppvVar8;
  pVVar7 = pNtk->vObjs;
  iVar6 = pVVar7->nSize;
  vBest = (Vec_Int_t *)malloc(0x10);
  iVar19 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar19 = iVar6;
  }
  vBest->nCap = iVar19;
  if (iVar19 == 0) {
    vBest->pArray = (int *)0x0;
    vBest->nSize = iVar6;
  }
  else {
    piVar9 = (int *)malloc((long)iVar19 << 2);
    vBest->pArray = piVar9;
    vBest->nSize = iVar6;
    if (piVar9 != (int *)0x0) {
      memset(piVar9,0xff,(long)iVar6 << 2);
    }
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar6 = pVVar7->nSize;
    uVar17 = (long)iVar6 + 500;
    iVar19 = (int)uVar17;
    if ((pNtk->vTravIds).nCap < iVar19) {
      piVar9 = (int *)malloc(uVar17 * 4);
      (pNtk->vTravIds).pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar19;
    }
    else {
      piVar9 = (int *)0x0;
    }
    if (-500 < iVar6) {
      memset(piVar9,0,(uVar17 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar19;
  }
  iVar6 = pNtk->nTravIds;
  pNtk->nTravIds = iVar6 + 1;
  if (0x3ffffffe < iVar6) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  iVar6 = Abc_NtkDelayTraceCritPath_rec
                    (local_60,(Abc_Obj_t *)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray],pIn,
                     vBest);
  if (iVar6 == 0) {
    if (pIn == (Abc_Obj_t *)0x0) {
      pcVar11 = Abc_ObjName(pOut);
      printf("The logic cone of PO \"%s\" has no primary inputs.\n",pcVar11);
    }
    else {
      pcVar11 = Abc_ObjName(pIn);
      pcVar12 = Abc_ObjName(pOut);
      printf("There is no combinational path between PI \"%s\" and PO \"%s\".\n",pcVar11,pcVar12);
    }
  }
  else {
    pAVar10 = Abc_NodeReadRequired(pOut);
    fVar23 = pAVar10->Rise;
    pAVar10 = Abc_NodeReadRequired(pOut);
    if (pAVar10->Fall <= fVar23) {
      fVar23 = pAVar10->Fall;
    }
    pAVar18 = (Abc_Obj_t *)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray];
    pfVar3 = (float *)pAVar18->pNtk->pManTime->vArrs->pArray[pAVar18->Id];
    fVar21 = *pfVar3;
    fVar22 = pfVar3[1];
    if (fVar21 <= fVar22) {
      fVar21 = fVar22;
    }
    Abc_NtkDelayTraceCritPathCollect_rec(local_60,pAVar18,vBest,vPath);
    uVar5 = vPath->nSize;
    if (pIn == (Abc_Obj_t *)0x0) {
      if ((int)uVar5 < 1) {
LAB_0031cc87:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      local_68 = (Abc_Obj_t *)*vPath->pArray;
LAB_0031c7de:
      ppvVar8 = vPath->pArray;
      uVar17 = 0;
      local_70 = 0;
      do {
        iVar6 = local_70;
        if ((*(uint *)((long)ppvVar8[uVar17] + 0x14) & 0xf) == 7) {
          pcVar11 = Mio_GateReadName(*(Mio_Gate_t **)((long)ppvVar8[uVar17] + 0x38));
          sVar13 = strlen(pcVar11);
          iVar6 = (int)sVar13;
          if ((int)sVar13 < local_70) {
            iVar6 = local_70;
          }
        }
        local_70 = iVar6;
        uVar17 = uVar17 + 1;
      } while (uVar5 != uVar17);
    }
    else {
      local_68 = pIn;
      if (0 < (int)uVar5) goto LAB_0031c7de;
      local_70 = 0;
    }
    Abc_NtkLevel(pNtk);
    pcVar11 = Abc_ObjName(local_68);
    pcVar12 = Abc_ObjName(pOut);
    printf("Critical path from PI \"%s\" to PO \"%s\":\n",pcVar11,pcVar12);
    iVar6 = vPath->nSize;
    if (0 < (long)iVar6) {
      ppvVar8 = vPath->pArray;
      lVar16 = 0;
      do {
        pAVar18 = (Abc_Obj_t *)ppvVar8[lVar16];
        printf("Level %3d : ",(ulong)(*(uint *)&pAVar18->field_0x14 >> 0xc));
        uVar5 = *(uint *)&pAVar18->field_0x14 & 0xf;
        pcVar11 = "Primary input \"%s\".   ";
        pcVar12 = "Arrival time =%6.1f. ";
        if (uVar5 == 2) {
LAB_0031cab4:
          pcVar14 = Abc_ObjName(pAVar18);
          printf(pcVar11,pcVar14);
        }
        else {
          pcVar11 = "Primary input \"%s\".   ";
          pcVar12 = "Arrival time =%6.1f. ";
          if (uVar5 == 5) goto LAB_0031cab4;
          pcVar11 = "Primary output \"%s\".   ";
          pcVar12 = "Arrival =%6.1f. ";
          if (0xfffffffd < uVar5 - 5) goto LAB_0031cab4;
          if (uVar5 != 7) {
            __assert_fail("Abc_ObjIsNode(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                          ,0x43c,
                          "float Abc_NtkDelayTrace(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
          }
          if (lVar16 == 0) goto LAB_0031cc87;
          iPin = Abc_NodeFindFanin(pAVar18,(Abc_Obj_t *)ppvVar8[lVar16 + -1]);
          iVar19 = pAVar18->Id;
          if (((((long)iVar19 < 0) || (local_60->nSize <= iVar19)) ||
              (uVar5 = local_60->pArray[iVar19] + iPin, (int)uVar5 < 0)) ||
             ((uint)local_60->nSize <= uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pcVar11 = Abc_ObjName(pAVar18);
          printf("%10s/",pcVar11);
          pcVar11 = Mio_GateReadPinName((Mio_Gate_t *)(pAVar18->field_5).pData,iPin);
          printf("%-4s",pcVar11);
          pcVar11 = Mio_GateReadName((Mio_Gate_t *)(pAVar18->field_5).pData);
          printf(" (%s)",pcVar11);
          pcVar11 = Mio_GateReadName((Mio_Gate_t *)(pAVar18->field_5).pData);
          sVar13 = strlen(pcVar11);
          iVar19 = local_70 - (int)sVar13;
          if (iVar19 != 0 && (int)sVar13 <= local_70) {
            do {
              putchar(0x20);
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          printf("   ");
          pfVar3 = (float *)pAVar18->pNtk->pManTime->vArrs->pArray[pAVar18->Id];
          fVar22 = *pfVar3;
          fVar1 = pfVar3[1];
          if (fVar22 <= fVar1) {
            fVar22 = fVar1;
          }
          printf("Arrival =%6.1f.   ",(double)fVar22);
          printf("I/O times: (");
          pcVar12 = " -> %.1f)";
          if (0 < (pAVar18->vFanins).nSize) {
            lVar15 = 0;
            do {
              plVar2 = (long *)pAVar18->pNtk->vObjs->pArray[(pAVar18->vFanins).pArray[lVar15]];
              pcVar11 = "    \"%s\", ";
              if (lVar15 == 0) {
                pcVar11 = "T = %d\t\t";
              }
              pfVar3 = *(float **)
                        (*(long *)(*(long *)(*(long *)(*plVar2 + 0x108) + 0x10) + 8) +
                        (long)(int)plVar2[2] * 8);
              fVar22 = *pfVar3;
              fVar1 = pfVar3[1];
              if (fVar22 <= fVar1) {
                fVar22 = fVar1;
              }
              printf("%s%.1f",(double)fVar22,pcVar11 + 8);
              lVar15 = lVar15 + 1;
            } while (lVar15 < (pAVar18->vFanins).nSize);
            pcVar12 = " -> %.1f)";
          }
        }
        pfVar3 = (float *)pAVar18->pNtk->pManTime->vArrs->pArray[pAVar18->Id];
        fVar22 = *pfVar3;
        fVar1 = pfVar3[1];
        if (fVar22 <= fVar1) {
          fVar22 = fVar1;
        }
        printf(pcVar12,(double)fVar22);
        putchar(10);
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar6);
    }
    printf("Level %3d : ",
           (ulong)((*(uint *)((long)pOut->pNtk->vObjs->pArray[*(pOut->vFanins).pArray] + 0x14) >>
                   0xc) + 1));
    pcVar11 = Abc_ObjName(pOut);
    printf("Primary output \"%s\".   ",pcVar11);
    pAVar10 = Abc_NodeReadRequired(pOut);
    fVar22 = pAVar10->Rise;
    pAVar10 = Abc_NodeReadRequired(pOut);
    if (pAVar10->Fall <= fVar22) {
      fVar22 = pAVar10->Fall;
    }
    printf("Required time = %6.1f.  ",(double)fVar22);
    printf("Path slack = %6.1f.\n",(double)(fVar23 - fVar21));
  }
  if (vPath->pArray != (void **)0x0) {
    free(vPath->pArray);
  }
  free(vPath);
  if (vBest->pArray != (int *)0x0) {
    free(vBest->pArray);
  }
  free(vBest);
LAB_0031cbf6:
  if (local_60 != (Vec_Int_t *)0x0) {
    if (local_60->pArray != (int *)0x0) {
      free(local_60->pArray);
    }
    free(local_60);
  }
  return fVar20;
}

Assistant:

float Abc_NtkDelayTrace( Abc_Ntk_t * pNtk, Abc_Obj_t * pOut, Abc_Obj_t * pIn, int fPrint )
{
    Vec_Int_t * vSlacks = NULL;
    Abc_Obj_t * pNode, * pDriver;
    Vec_Ptr_t * vNodes;
    Abc_Time_t * pTime;
    float tArrivalMax;
    int i;

    assert( Abc_NtkIsMappedLogic(pNtk) );
    assert( pOut == NULL || Abc_ObjIsCo(pOut) );
    assert( pIn == NULL || Abc_ObjIsCi(pIn) );

    // create slacks (need slacks if printing is requested even if pIn/pOut are not given)
    if ( pOut || pIn || fPrint )
        vSlacks = Abc_NtkDelayTraceSlackStart( pNtk );

    // compute the timing
    Abc_NtkTimePrepare( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Abc_NodeDelayTraceArrival( pNode, vSlacks );
    Vec_PtrFree( vNodes );

    // get the latest arrival times
    tArrivalMax = -ABC_INFINITY;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0(pNode);
        pTime   = Abc_NodeArrival(pDriver);
        if ( tArrivalMax < Abc_MaxFloat(pTime->Fall, pTime->Rise) )
            tArrivalMax = Abc_MaxFloat(pTime->Fall, pTime->Rise);
    }

    // determine the output to print
    if ( fPrint && pOut == NULL )
    {
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            pDriver = Abc_ObjFanin0(pNode);
            pTime   = Abc_NodeArrival(pDriver);
            if ( tArrivalMax == Abc_MaxFloat(pTime->Fall, pTime->Rise) )
                pOut = pNode;
        }
        assert( pOut != NULL );
    }

    if ( fPrint )
    {
        Vec_Ptr_t * vPath = Vec_PtrAlloc( 100 );
        Vec_Int_t * vBest = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
        // traverse to determine the critical path
        Abc_NtkIncrementTravId( pNtk );
        if ( !Abc_NtkDelayTraceCritPath_rec( vSlacks, Abc_ObjFanin0(pOut), pIn, vBest ) )
        {
            if ( pIn == NULL )
                printf( "The logic cone of PO \"%s\" has no primary inputs.\n", Abc_ObjName(pOut) );
            else
                printf( "There is no combinational path between PI \"%s\" and PO \"%s\".\n", Abc_ObjName(pIn), Abc_ObjName(pOut) );
        }
        else
        {
            float Slack = 0.0, SlackAdd;
            int k, iFanin, Length = 0;
            Abc_Obj_t * pFanin;
            // check the additional slack
            SlackAdd = Abc_NodeReadRequiredWorst(pOut) - Abc_NodeReadArrivalWorst(Abc_ObjFanin0(pOut));
            // collect the critical path
            Abc_NtkDelayTraceCritPathCollect_rec( vSlacks, Abc_ObjFanin0(pOut), vBest, vPath );
            if ( pIn == NULL )
                pIn = (Abc_Obj_t *)Vec_PtrEntry( vPath, 0 );
            // find the longest gate name
            Vec_PtrForEachEntry( Abc_Obj_t *, vPath, pNode, i )
                if ( Abc_ObjIsNode(pNode) )
                    Length = Abc_MaxInt( Length, strlen(Mio_GateReadName((Mio_Gate_t *)pNode->pData)) );
            // print critical path
            Abc_NtkLevel( pNtk );
            printf( "Critical path from PI \"%s\" to PO \"%s\":\n", Abc_ObjName(pIn), Abc_ObjName(pOut) ); 
            Vec_PtrForEachEntry( Abc_Obj_t *, vPath, pNode, i )
            {
                printf( "Level %3d : ", Abc_ObjLevel(pNode) );
                if ( Abc_ObjIsCi(pNode) )
                {
                    printf( "Primary input \"%s\".   ", Abc_ObjName(pNode) );
                    printf( "Arrival time =%6.1f. ", Abc_NodeReadArrivalWorst(pNode) );
                    printf( "\n" );
                    continue;
                }
                if ( Abc_ObjIsCo(pNode) )
                {
                    printf( "Primary output \"%s\".   ", Abc_ObjName(pNode) );
                    printf( "Arrival =%6.1f. ", Abc_NodeReadArrivalWorst(pNode) );
                }
                else
                {
                    assert( Abc_ObjIsNode(pNode) );
                    iFanin = Abc_NodeFindFanin( pNode, (Abc_Obj_t *)Vec_PtrEntry(vPath,i-1) );
                    Slack = Abc_NtkDelayTraceSlack(vSlacks, pNode, iFanin);
                    printf( "%10s/", Abc_ObjName(pNode) );
                    printf( "%-4s", Mio_GateReadPinName((Mio_Gate_t *)pNode->pData, iFanin) );
                    printf( " (%s)", Mio_GateReadName((Mio_Gate_t *)pNode->pData) );
                    for ( k = strlen(Mio_GateReadName((Mio_Gate_t *)pNode->pData)); k < Length; k++ )
                        printf( " " );
                    printf( "   " );
                    printf( "Arrival =%6.1f.   ", Abc_NodeReadArrivalWorst(pNode) );
                    printf( "I/O times: (" );
                    Abc_ObjForEachFanin( pNode, pFanin, k )
                        printf( "%s%.1f", (k? ", ":""), Abc_NodeReadArrivalWorst(pFanin) );
//                    printf( " -> %.1f)", Abc_NodeReadArrival(pNode)->Worst + Slack + SlackAdd );
                    printf( " -> %.1f)", Abc_NodeReadArrivalWorst(pNode) );
                }
                printf( "\n" );
            }
            printf( "Level %3d : ", Abc_ObjLevel(Abc_ObjFanin0(pOut)) + 1 );
            printf( "Primary output \"%s\".   ", Abc_ObjName(pOut) );
            printf( "Required time = %6.1f.  ", Abc_NodeReadRequiredWorst(pOut) );
            printf( "Path slack = %6.1f.\n", SlackAdd );
        }
        Vec_PtrFree( vPath );
        Vec_IntFree( vBest );
    }

    Vec_IntFreeP( &vSlacks );
    return tArrivalMax;
}